

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.cpp
# Opt level: O0

void __thiscall FIX::message_order::message_order(message_order *this,int *order,int size)

{
  int size_local;
  int *order_local;
  message_order *this_local;
  
  this->m_mode = group;
  this->m_delim = 0;
  shared_array<int>::shared_array(&this->m_groupOrder);
  this->m_largest = 0;
  setOrder(this,order,size);
  return;
}

Assistant:

message_order::message_order(const int order[], int size)
    : m_mode(group),
      m_delim(0),
      m_largest(0) {
  setOrder(order, size);
}